

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error storeAtts(XML_Parser parser,ENCODING *enc,char *attStr,TAG_NAME *tagNamePtr,
                   BINDING **bindingsPtr)

{
  STRING_POOL *pool;
  long lVar1;
  char cVar2;
  undefined1 uVar3;
  DEFAULT_ATTRIBUTE *pDVar4;
  XML_Char *pXVar5;
  undefined8 *puVar6;
  uint uVar7;
  int iVar8;
  XML_Error XVar9;
  ATTRIBUTE_ID *pAVar10;
  XML_Char *pXVar11;
  NAMED *pNVar12;
  undefined1 *puVar13;
  char *pcVar14;
  long *plVar15;
  long lVar16;
  int isCdata;
  ulong uVar17;
  int oldAttsSize;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  BINDING *b;
  BINDING *pBVar22;
  ulong uVar23;
  uint uVar24;
  int local_8c;
  ELEMENT_TYPE *local_88;
  ATTRIBUTE *local_80;
  
  if (tagNamePtr == (TAG_NAME *)0x0) {
    uVar24 = 0;
    local_88 = (ELEMENT_TYPE *)0x0;
LAB_0014e6f9:
    uVar7 = (*enc->getAtts)(enc,attStr,*(int *)((long)parser + 0x3f0),
                            *(ATTRIBUTE **)((long)parser + 0x400));
    iVar21 = *(int *)((long)parser + 0x3f0);
    local_80 = *(ATTRIBUTE **)((long)parser + 0x400);
    if (iVar21 < (int)(uVar7 + uVar24)) {
      *(uint *)((long)parser + 0x3f0) = uVar7 + uVar24 + 0x10;
      local_80 = (ATTRIBUTE *)(**(code **)((long)parser + 0x20))();
      *(ATTRIBUTE **)((long)parser + 0x400) = local_80;
      if (local_80 == (ATTRIBUTE *)0x0) goto LAB_0014e9f0;
      if (iVar21 < (int)uVar7) {
        (*enc->getAtts)(enc,attStr,uVar7,local_80);
        local_80 = *(ATTRIBUTE **)((long)parser + 0x400);
      }
    }
    uVar20 = 0;
    uVar23 = (ulong)uVar24;
    if ((int)uVar24 < 1) {
      uVar23 = uVar20;
    }
    pool = (STRING_POOL *)((long)parser + 0x418);
    uVar17 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar17 = uVar20;
    }
    local_8c = 0;
    iVar21 = 0;
    for (; uVar20 != uVar17; uVar20 = uVar20 + 1) {
      lVar19 = uVar20 * 0x20;
      pcVar18 = *(char **)(*(long *)((long)parser + 0x400) + lVar19);
      iVar8 = (*enc->nameLength)(enc,pcVar18);
      pAVar10 = getAttributeId(parser,enc,pcVar18,pcVar18 + iVar8);
      if (pAVar10 == (ATTRIBUTE_ID *)0x0) goto LAB_0014e9f0;
      if (pAVar10->name[-1] != '\0') {
        if (*(ENCODING **)((long)parser + 0x118) != enc) {
          return XML_ERROR_DUPLICATE_ATTRIBUTE;
        }
        *(undefined8 *)((long)parser + 0x218) =
             *(undefined8 *)(*(long *)((long)parser + 0x400) + lVar19);
        return XML_ERROR_DUPLICATE_ATTRIBUTE;
      }
      pAVar10->name[-1] = '\x01';
      iVar8 = iVar21 + 1;
      (&local_80->name)[iVar21] = pAVar10->name;
      lVar1 = *(long *)((long)parser + 0x400) + lVar19;
      if (*(char *)(*(long *)((long)parser + 0x400) + 0x18 + lVar19) == '\0') {
        isCdata = 1;
        if (pAVar10->maybeTokenized != '\0') {
          lVar19 = 0;
          do {
            lVar16 = lVar19;
            if (uVar23 * 0x18 + 0x18 == lVar16 + 0x18) {
              isCdata = 1;
              goto LAB_0014e8e4;
            }
            lVar19 = lVar16 + 0x18;
          } while (pAVar10 != *(ATTRIBUTE_ID **)((long)&local_88->defaultAtts->id + lVar16));
          isCdata = (int)(&local_88->defaultAtts->isCdata)[lVar16];
        }
LAB_0014e8e4:
        XVar9 = storeAttributeValue(parser,enc,isCdata,*(char **)(lVar1 + 8),
                                    *(char **)(lVar1 + 0x10),pool);
        if (XVar9 != XML_ERROR_NONE) {
          return XVar9;
        }
        if (tagNamePtr != (TAG_NAME *)0x0) {
          (&local_80->name)[iVar8] = *(char **)((long)parser + 0x438);
          goto LAB_0014e91b;
        }
        *(char **)((long)parser + 0x430) = *(char **)((long)parser + 0x438);
LAB_0014e96c:
        iVar21 = iVar21 + 2;
      }
      else {
        if (tagNamePtr == (TAG_NAME *)0x0) goto LAB_0014e96c;
        pXVar11 = poolStoreString(pool,enc,*(char **)(lVar1 + 8),*(char **)(lVar1 + 0x10));
        (&local_80->name)[iVar8] = pXVar11;
        if (pXVar11 == (XML_Char *)0x0) goto LAB_0014e9f0;
LAB_0014e91b:
        *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
        if ((tagNamePtr == (TAG_NAME *)0x0) || (pAVar10->prefix == (PREFIX *)0x0))
        goto LAB_0014e96c;
        if (pAVar10->xmlns == '\0') {
          iVar21 = iVar21 + 2;
          local_8c = local_8c + 1;
          pAVar10->name[-1] = '\x02';
        }
        else {
          iVar8 = addBinding(parser,pAVar10->prefix,pAVar10,(&local_80->name)[iVar8],bindingsPtr);
          if (iVar8 == 0) goto LAB_0014e9f0;
        }
      }
    }
    if (tagNamePtr != (TAG_NAME *)0x0) {
      *(int *)((long)parser + 0x3f4) = iVar21;
      lVar19 = -1;
      if ((local_88->idAtt == (ATTRIBUTE_ID *)0x0) ||
         (pcVar18 = local_88->idAtt->name, pcVar18[-1] == '\0')) {
LAB_0014ea6c:
        *(int *)((long)parser + 0x3f8) = (int)lVar19;
      }
      else {
        for (lVar19 = 0; lVar19 < iVar21; lVar19 = lVar19 + 2) {
          if ((&local_80->name)[lVar19] == pcVar18) goto LAB_0014ea6c;
        }
      }
      for (lVar19 = 0; uVar23 * 0x18 - lVar19 != 0; lVar19 = lVar19 + 0x18) {
        pDVar4 = local_88->defaultAtts;
        pAVar10 = *(ATTRIBUTE_ID **)((long)&pDVar4->id + lVar19);
        pXVar11 = pAVar10->name;
        if ((pXVar11[-1] == '\0') &&
           (pXVar5 = *(XML_Char **)((long)&pDVar4->value + lVar19), pXVar5 != (XML_Char *)0x0)) {
          if (pAVar10->prefix == (PREFIX *)0x0) {
            pXVar11[-1] = '\x01';
          }
          else {
            if (pAVar10->xmlns != '\0') {
              iVar8 = addBinding(parser,pAVar10->prefix,pAVar10,pXVar5,bindingsPtr);
              if (iVar8 != 0) goto LAB_0014eaa5;
              goto LAB_0014e9f0;
            }
            pXVar11[-1] = '\x02';
            local_8c = local_8c + 1;
          }
          (&local_80->name)[iVar21] = (char *)**(undefined8 **)((long)&pDVar4->id + lVar19);
          (&local_80->valuePtr)[iVar21] = *(char **)((long)&pDVar4->value + lVar19);
          iVar21 = iVar21 + 2;
        }
LAB_0014eaa5:
      }
      (&local_80->name)[iVar21] = (char *)0x0;
    }
    if (local_8c == 0) {
      uVar23 = 0;
    }
    else {
      for (uVar23 = 0; (long)uVar23 < (long)iVar21; uVar23 = uVar23 + 2) {
        cVar2 = (&local_80->name)[uVar23][-1];
        (&local_80->name)[uVar23][-1] = '\0';
        if (cVar2 == '\x02') {
          pNVar12 = lookup((HASH_TABLE *)((long)parser + 0x2e0),(&local_80->name)[uVar23],0);
          puVar6 = *(undefined8 **)(pNVar12[1].name + 8);
          if (puVar6 != (undefined8 *)0x0) {
            pcVar18 = (&local_80->name)[uVar23];
            for (lVar19 = 0; lVar19 < *(int *)(puVar6 + 5); lVar19 = lVar19 + 1) {
              puVar13 = *(undefined1 **)((long)parser + 0x430);
              if (puVar13 == *(undefined1 **)((long)parser + 0x428)) {
                iVar8 = poolGrow(pool);
                if (iVar8 == 0) goto LAB_0014e9f0;
                puVar13 = *(undefined1 **)((long)parser + 0x430);
              }
              uVar3 = *(undefined1 *)(puVar6[4] + lVar19);
              *(undefined1 **)((long)parser + 0x430) = puVar13 + 1;
              *puVar13 = uVar3;
            }
            do {
              cVar2 = *pcVar18;
              pcVar18 = pcVar18 + 1;
            } while (cVar2 != ':');
            do {
              pcVar14 = *(char **)((long)parser + 0x430);
              if (pcVar14 == *(char **)((long)parser + 0x428)) {
                iVar8 = poolGrow(pool);
                if (iVar8 == 0) goto LAB_0014e9f0;
                pcVar14 = *(char **)((long)parser + 0x430);
              }
              cVar2 = *pcVar18;
              *(char **)((long)parser + 0x430) = pcVar14 + 1;
              *pcVar14 = cVar2;
              cVar2 = *pcVar18;
              pcVar18 = pcVar18 + 1;
            } while (cVar2 != '\0');
            if (*(int *)((long)parser + 0x1cc) != 0) {
              *(undefined1 *)(*(long *)((long)parser + 0x430) + -1) =
                   *(undefined1 *)((long)parser + 0x488);
              pcVar18 = *(char **)*puVar6;
              do {
                pcVar14 = *(char **)((long)parser + 0x430);
                if (pcVar14 == *(char **)((long)parser + 0x428)) {
                  iVar8 = poolGrow(pool);
                  if (iVar8 == 0) goto LAB_0014e9f0;
                  pcVar14 = *(char **)((long)parser + 0x430);
                }
                cVar2 = *pcVar18;
                *(char **)((long)parser + 0x430) = pcVar14 + 1;
                *pcVar14 = cVar2;
                cVar2 = *pcVar18;
                pcVar18 = pcVar18 + 1;
              } while (cVar2 != '\0');
            }
            (&local_80->name)[uVar23] = *(char **)((long)parser + 0x438);
            *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
          }
          local_8c = local_8c + -1;
          if (local_8c == 0) break;
        }
      }
      uVar23 = uVar23 & 0xffffffff;
    }
    for (; (long)uVar23 < (long)iVar21; uVar23 = uVar23 + 2) {
      (&local_80->name)[uVar23][-1] = '\0';
    }
    XVar9 = XML_ERROR_NONE;
    if (tagNamePtr != (TAG_NAME *)0x0) {
      while (pBVar22 = *bindingsPtr, pBVar22 != (BINDING *)0x0) {
        pBVar22->attId->name[-1] = '\0';
        bindingsPtr = &pBVar22->nextTagBinding;
      }
      if (local_88->prefix == (PREFIX *)0x0) {
        pBVar22 = *(BINDING **)((long)parser + 0x398);
        if (pBVar22 == (BINDING *)0x0) {
          return XML_ERROR_NONE;
        }
        pcVar18 = tagNamePtr->str;
      }
      else {
        pBVar22 = local_88->prefix->binding;
        if (pBVar22 == (BINDING *)0x0) {
          return XML_ERROR_NONE;
        }
        pcVar18 = tagNamePtr->str;
        do {
          cVar2 = *pcVar18;
          pcVar18 = pcVar18 + 1;
        } while (cVar2 != ':');
      }
      tagNamePtr->localPart = pcVar18;
      iVar21 = pBVar22->uriLen;
      tagNamePtr->uriLen = iVar21;
      uVar23 = 0;
      do {
        pcVar14 = pcVar18 + uVar23;
        uVar23 = uVar23 + 1;
      } while (*pcVar14 != '\0');
      if (pBVar22->uriAlloc < iVar21 + (int)uVar23) {
        iVar21 = iVar21 + 0x18 + (int)uVar23;
        pXVar11 = (XML_Char *)(**(code **)((long)parser + 0x18))((long)iVar21);
        if (pXVar11 == (XML_Char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        pBVar22->uriAlloc = iVar21;
        memcpy(pXVar11,pBVar22->uri,(long)pBVar22->uriLen);
        plVar15 = (long *)((long)parser + 0x3d0);
        pXVar5 = pBVar22->uri;
        while (plVar15 = (long *)*plVar15, plVar15 != (long *)0x0) {
          if ((XML_Char *)plVar15[3] == pXVar5) {
            plVar15[3] = (long)pXVar11;
          }
        }
        (**(code **)((long)parser + 0x28))();
        pBVar22->uri = pXVar11;
        iVar21 = pBVar22->uriLen;
      }
      else {
        pXVar11 = pBVar22->uri;
      }
      memcpy(pXVar11 + iVar21,pcVar18,uVar23 & 0xffffffff);
      tagNamePtr->str = pBVar22->uri;
      XVar9 = XML_ERROR_NONE;
    }
  }
  else {
    local_88 = (ELEMENT_TYPE *)lookup((HASH_TABLE *)((long)parser + 0x2b8),tagNamePtr->str,0);
    if (local_88 != (ELEMENT_TYPE *)0x0) {
LAB_0014e6e2:
      uVar24 = local_88->nDefaultAtts;
      goto LAB_0014e6f9;
    }
    pXVar11 = poolCopyString((STRING_POOL *)((long)parser + 0x330),tagNamePtr->str);
    tagNamePtr->str = pXVar11;
    if (((pXVar11 != (XML_Char *)0x0) &&
        (local_88 = (ELEMENT_TYPE *)lookup((HASH_TABLE *)((long)parser + 0x2b8),pXVar11,0x28),
        local_88 != (ELEMENT_TYPE *)0x0)) &&
       ((*(int *)((long)parser + 0x1c8) == 0 ||
        (iVar21 = setElementTypePrefix(parser,local_88), iVar21 != 0)))) goto LAB_0014e6e2;
LAB_0014e9f0:
    XVar9 = XML_ERROR_NO_MEMORY;
  }
  return XVar9;
}

Assistant:

static enum XML_Error storeAtts(XML_Parser parser, const ENCODING *enc,
                                const char *attStr, TAG_NAME *tagNamePtr,
                                BINDING **bindingsPtr)
{
  ELEMENT_TYPE *elementType = 0;
  int nDefaultAtts = 0;
  const XML_Char **appAtts;   /* the attribute list to pass to the application */
  int attIndex = 0;
  int i;
  int n;
  int nPrefixes = 0;
  BINDING *binding;
  const XML_Char *localPart;

  /* lookup the element type name */
  if (tagNamePtr) {
    elementType = (ELEMENT_TYPE *)lookup(&dtd.elementTypes, tagNamePtr->str,0);
    if (!elementType) {
      tagNamePtr->str = poolCopyString(&dtd.pool, tagNamePtr->str);
      if (!tagNamePtr->str)
        return XML_ERROR_NO_MEMORY;
      elementType = (ELEMENT_TYPE *)lookup(&dtd.elementTypes, tagNamePtr->str, sizeof(ELEMENT_TYPE));
      if (!elementType)
        return XML_ERROR_NO_MEMORY;
      if (ns && !setElementTypePrefix(parser, elementType))
        return XML_ERROR_NO_MEMORY;
    }
    nDefaultAtts = elementType->nDefaultAtts;
  }
  /* get the attributes from the tokenizer */
  n = XmlGetAttributes(enc, attStr, attsSize, atts);
  if (n + nDefaultAtts > attsSize) {
    int oldAttsSize = attsSize;
    attsSize = n + nDefaultAtts + INIT_ATTS_SIZE;
    atts = REALLOC((void *)atts, attsSize * sizeof(ATTRIBUTE));
    if (!atts)
      return XML_ERROR_NO_MEMORY;
    if (n > oldAttsSize)
      XmlGetAttributes(enc, attStr, n, atts);
  }
  appAtts = (const XML_Char **)atts;
  for (i = 0; i < n; i++) {
    /* add the name and value to the attribute list */
    ATTRIBUTE_ID *attId = getAttributeId(parser, enc, atts[i].name,
                                         atts[i].name
                                         + XmlNameLength(enc, atts[i].name));
    if (!attId)
      return XML_ERROR_NO_MEMORY;
    /* detect duplicate attributes */
    if ((attId->name)[-1]) {
      if (enc == encoding)
        eventPtr = atts[i].name;
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    (attId->name)[-1] = 1;
    appAtts[attIndex++] = attId->name;
    if (!atts[i].normalized) {
      enum XML_Error result;
      int isCdata = 1;

      /* figure out whether declared as other than CDATA */
      if (attId->maybeTokenized) {
        int j;
        for (j = 0; j < nDefaultAtts; j++) {
          if (attId == elementType->defaultAtts[j].id) {
            isCdata = elementType->defaultAtts[j].isCdata;
            break;
          }
        }
      }

      /* normalize the attribute value */
      result = storeAttributeValue(parser, enc, isCdata,
                                   atts[i].valuePtr, atts[i].valueEnd,
                                   &tempPool);
      if (result)
        return result;
      if (tagNamePtr) {
        appAtts[attIndex] = poolStart(&tempPool);
        poolFinish(&tempPool);
      }
      else
        poolDiscard(&tempPool);
    }
    else if (tagNamePtr) {
      /* the value did not need normalizing */
      appAtts[attIndex] = poolStoreString(&tempPool, enc, atts[i].valuePtr, atts[i].valueEnd);
      if (appAtts[attIndex] == 0)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&tempPool);
    }
    /* handle prefixed attribute names */
    if (attId->prefix && tagNamePtr) {
      if (attId->xmlns) {
        /* deal with namespace declarations here */
        if (!addBinding(parser, attId->prefix, attId, appAtts[attIndex], bindingsPtr))
          return XML_ERROR_NO_MEMORY;
        --attIndex;
      }
      else {
        /* deal with other prefixed names later */
        attIndex++;
        nPrefixes++;
        (attId->name)[-1] = 2;
      }
    }
    else
      attIndex++;
  }
  if (tagNamePtr) {
    int j;
    nSpecifiedAtts = attIndex;
    if (elementType->idAtt && (elementType->idAtt->name)[-1]) {
      for (i = 0; i < attIndex; i += 2)
        if (appAtts[i] == elementType->idAtt->name) {
          idAttIndex = i;
          break;
        }
    }
    else
      idAttIndex = -1;
    /* do attribute defaulting */
    for (j = 0; j < nDefaultAtts; j++) {
      const DEFAULT_ATTRIBUTE *da = elementType->defaultAtts + j;
      if (!(da->id->name)[-1] && da->value) {
        if (da->id->prefix) {
          if (da->id->xmlns) {
            if (!addBinding(parser, da->id->prefix, da->id, da->value, bindingsPtr))
              return XML_ERROR_NO_MEMORY;
          }
          else {
            (da->id->name)[-1] = 2;
            nPrefixes++;
            appAtts[attIndex++] = da->id->name;
            appAtts[attIndex++] = da->value;
          }
        }
        else {
          (da->id->name)[-1] = 1;
          appAtts[attIndex++] = da->id->name;
          appAtts[attIndex++] = da->value;
        }
      }
    }
    appAtts[attIndex] = 0;
  }
  i = 0;
  if (nPrefixes) {
    /* expand prefixed attribute names */
    for (; i < attIndex; i += 2) {
      if (appAtts[i][-1] == 2) {
        ATTRIBUTE_ID *id;
        ((XML_Char *)(appAtts[i]))[-1] = 0;
        id = (ATTRIBUTE_ID *)lookup(&dtd.attributeIds, appAtts[i], 0);
        if (id->prefix->binding) {
          int j;
          const BINDING *b = id->prefix->binding;
          const XML_Char *s = appAtts[i];
          for (j = 0; j < b->uriLen; j++) {
            if (!poolAppendChar(&tempPool, b->uri[j]))
              return XML_ERROR_NO_MEMORY;
          }
          while (*s++ != ':')
            ;
          do {
            if (!poolAppendChar(&tempPool, *s))
              return XML_ERROR_NO_MEMORY;
          } while (*s++);
          if (ns_triplets) {
            tempPool.ptr[-1] = namespaceSeparator;
            s = b->prefix->name;
            do {
              if (!poolAppendChar(&tempPool, *s))
                return XML_ERROR_NO_MEMORY;
            } while (*s++);
          }

          appAtts[i] = poolStart(&tempPool);
          poolFinish(&tempPool);
        }
        if (!--nPrefixes)
          break;
      }
      else
        ((XML_Char *)(appAtts[i]))[-1] = 0;
    }
  }
  /* clear the flags that say whether attributes were specified */
  for (; i < attIndex; i += 2)
    ((XML_Char *)(appAtts[i]))[-1] = 0;
  if (!tagNamePtr)
    return XML_ERROR_NONE;
  for (binding = *bindingsPtr; binding; binding = binding->nextTagBinding)
    binding->attId->name[-1] = 0;
  /* expand the element type name */
  if (elementType->prefix) {
    binding = elementType->prefix->binding;
    if (!binding)
      return XML_ERROR_NONE;
    localPart = tagNamePtr->str;
    while (*localPart++ != XML_T(':'))
      ;
  }
  else if (dtd.defaultPrefix.binding) {
    binding = dtd.defaultPrefix.binding;
    localPart = tagNamePtr->str;
  }
  else
    return XML_ERROR_NONE;
  tagNamePtr->localPart = localPart;
  tagNamePtr->uriLen = binding->uriLen;
  for (i = 0; localPart[i++];)
    ;
  n = i + binding->uriLen;
  if (n > binding->uriAlloc) {
    TAG *p;
    XML_Char *uri = MALLOC((n + EXPAND_SPARE) * sizeof(XML_Char));
    if (!uri)
      return XML_ERROR_NO_MEMORY;
    binding->uriAlloc = n + EXPAND_SPARE;
    memcpy(uri, binding->uri, binding->uriLen * sizeof(XML_Char));
    for (p = tagStack; p; p = p->parent)
      if (p->name.str == binding->uri)
        p->name.str = uri;
    FREE(binding->uri);
    binding->uri = uri;
  }
  memcpy(binding->uri + binding->uriLen, localPart, i * sizeof(XML_Char));
  tagNamePtr->str = binding->uri;
  return XML_ERROR_NONE;
}